

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex(PaHostApiTypeId type)

{
  int i;
  PaHostApiIndex result;
  PaHostApiTypeId type_local;
  
  if (initializationCount_ == 0) {
    result = -10000;
  }
  else {
    result = -0x26fb;
    for (i = 0; i < hostApisCount_; i = i + 1) {
      if ((hostApis_[i]->info).type == type) {
        return i;
      }
    }
  }
  return result;
}

Assistant:

PaHostApiIndex Pa_HostApiTypeIdToHostApiIndex( PaHostApiTypeId type )
{
    PaHostApiIndex result;
    int i;

    PA_LOGAPI_ENTER_PARAMS( "Pa_HostApiTypeIdToHostApiIndex" );
    PA_LOGAPI(("\tPaHostApiTypeId type: %d\n", type ));

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;

        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                result = i;
                break;
            }
        }
    }

    PA_LOGAPI_EXIT_PAERROR_OR_T_RESULT( "Pa_HostApiTypeIdToHostApiIndex", "PaHostApiIndex: %d", result );

    return result;
}